

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::AddLinkLibrary
          (cmTarget *this,cmMakefile *mf,string *lib,string *libRef,cmTargetLinkLibraryType llt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  size_t __n_00;
  pointer pcVar2;
  cmMakefile *this_00;
  int iVar3;
  PolicyStatus PVar4;
  cmTarget *pcVar5;
  long *plVar6;
  size_type sVar7;
  char *pcVar8;
  ulong *puVar9;
  byte bVar10;
  string libName;
  string targetEntry;
  cmTargetLinkLibraryType local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cmMakefile *local_58;
  string local_50;
  
  bVar10 = 0;
  local_9c = llt;
  local_58 = mf;
  pcVar5 = cmMakefile::FindTargetToUse(mf,lib,false);
  if (pcVar5 != (cmTarget *)0x0) {
    bVar10 = pcVar5->IsImportedTarget ^ 1;
  }
  if ((bVar10 == 0) || (local_9c == GENERAL_LibraryType)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar2 = (libRef->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + libRef->_M_string_length);
  }
  else {
    std::operator+(&local_78,"$<TARGET_NAME:",libRef);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_98.field_2._M_allocated_capacity = *puVar9;
      local_98.field_2._8_8_ = plVar6[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar9;
      local_98._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_98._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"LINK_LIBRARIES","");
  GetDebugGeneratorExpressions(&local_50,this,&local_98,local_9c);
  AppendProperty(this,&local_78,local_50._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  sVar7 = cmGeneratorExpression::Find(lib);
  if ((sVar7 == 0xffffffffffffffff) &&
     (__n = lib->_M_string_length, __n == libRef->_M_string_length)) {
    if ((__n != 0) &&
       (iVar3 = bcmp((lib->_M_dataplus)._M_p,(libRef->_M_dataplus)._M_p,__n), iVar3 != 0)) {
      return;
    }
    if ((pcVar5 == (cmTarget *)0x0) ||
       ((pcVar5->TargetTypeValue != OBJECT_LIBRARY && (pcVar5->TargetTypeValue != INTERFACE_LIBRARY)
        ))) {
      __n_00 = (this->Name)._M_string_length;
      if (__n_00 == __n) {
        if (__n_00 == 0) {
          return;
        }
        iVar3 = bcmp((this->Name)._M_dataplus._M_p,(lib->_M_dataplus)._M_p,__n_00);
        if (iVar3 == 0) {
          return;
        }
      }
      std::
      vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
      ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
                ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
                  *)&this->OriginalLinkLibraries,lib,&local_9c);
      if (this->TargetTypeValue - STATIC_LIBRARY < 3) {
        PVar4 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0073);
        if ((PVar4 != OLD) &&
           (PVar4 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0073), PVar4 != WARN)) {
          return;
        }
        pcVar2 = (this->Name)._M_dataplus._M_p;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + (this->Name)._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        this_00 = local_58;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity =
             local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_98._M_dataplus._M_p = (pointer)paVar1;
        pcVar8 = cmMakefile::GetDefinition(local_58,&local_78);
        if (pcVar8 != (char *)0x0) {
          std::__cxx11::string::append((char *)&local_98);
        }
        if (local_9c < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
          std::__cxx11::string::append((char *)&local_98);
        }
        std::__cxx11::string::append((char *)&local_98);
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)(lib->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_98);
        cmMakefile::AddCacheDefinition
                  (this_00,&local_78,local_98._M_dataplus._M_p,"Dependencies for the target",STATIC,
                   false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              std::string const& libRef,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(libRef)
      : libRef;
    this->AppendProperty(
      "LINK_LIBRARIES",
      this->GetDebugGeneratorExpressions(libName, llt).c_str());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos || lib != libRef ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->Name == lib)) {
    return;
  }

  this->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->TargetTypeValue >= cmStateEnums::STATIC_LIBRARY &&
      this->TargetTypeValue <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = this->Name;
    targetEntry += "_LIB_DEPENDS";
    std::string dependencies;
    const char* old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies.c_str(),
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}